

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O2

CodeWord ZXing::Pdf417::ReadCodeWord<ZXing::PointT<double>>
                   (BitMatrixCursor<ZXing::PointT<double>_> *cur,int expectedCluster)

{
  BitMatrix *pBVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  bool bVar5;
  CodeWord CVar6;
  ulong uVar7;
  long lVar8;
  undefined4 uVar9;
  anon_class_4_1_5471c602 readCodeWord;
  int local_ac;
  PointT<double> local_a8;
  CodeWord local_98;
  BitMatrixCursor<ZXing::PointT<double>_> local_90;
  double local_68;
  double dStack_60;
  double local_50;
  undefined8 local_48;
  undefined4 uStack_40;
  uint uStack_3c;
  double local_38;
  
  pBVar1 = cur->img;
  local_68 = (cur->p).x;
  dStack_60 = (cur->p).y;
  local_a8 = cur->d;
  local_ac = expectedCluster;
  local_98 = ReadCodeWord<ZXing::PointT<double>>(ZXing::BitMatrixCursor<ZXing::PointT<double>>&,int)
             ::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_ac,cur);
  CVar6 = local_98;
  if (0xfffffffeffffffff < (ulong)local_98) {
    local_50 = local_a8.y;
    local_48._0_4_ = local_a8.x._0_4_;
    local_48._4_4_ = local_a8.x._4_4_ ^ 0x80000000;
    uStack_40 = local_a8.y._0_4_;
    uStack_3c = local_a8.y._4_4_ ^ 0x80000000;
    local_38 = local_a8.x;
    uVar9 = local_a8.y._0_4_;
    uVar4 = local_a8.y._4_4_;
    if (ABS(local_a8.y) <= ABS(local_a8.x)) {
      uVar9 = local_a8.x._0_4_;
      uVar4 = local_a8.x._4_4_;
    }
    auVar3._8_4_ = uVar9;
    auVar3._0_8_ = CONCAT44(uVar4,uVar9) & 0x7fffffffffffffff;
    auVar3._12_4_ = uVar4 & 0x7fffffff;
    local_a8 = (PointT<double>)divpd((undefined1  [16])local_a8,auVar3);
    for (lVar8 = 0; CVar6 = local_98, lVar8 != 0x20; lVar8 = lVar8 + 0x10) {
      dVar2 = *(double *)((long)&local_48 + lVar8) + dStack_60;
      local_90.p.y._0_4_ = SUB84(dVar2,0);
      local_90.p.x = *(double *)((long)&local_50 + lVar8) + local_68;
      local_90.p.y._4_4_ = (int)((ulong)dVar2 >> 0x20);
      local_90.img = pBVar1;
      local_90.d.x._0_4_ = local_a8.x._0_4_;
      local_90.d.x._4_4_ = local_a8.x._4_4_;
      local_90.d.y._0_4_ = local_a8.y._0_4_;
      local_90.d.y._4_4_ = local_a8.y._4_4_;
      bVar5 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(&local_90);
      if (bVar5) {
        CVar6 = ReadCodeWord<ZXing::PointT<double>>(ZXing::BitMatrixCursor<ZXing::PointT<double>>&,int)
                ::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_ac,&local_90);
        uVar7 = (ulong)CVar6 >> 0x20;
        if (uVar7 != 0xffffffff) {
          (cur->d).y = (double)CONCAT44(local_90.d.y._4_4_,local_90.d.y._0_4_);
          (cur->p).y = local_90.p.y;
          (cur->d).x = (double)CONCAT44(local_90.d.x._4_4_,local_90.d.x._0_4_);
          cur->img = local_90.img;
          (cur->p).x = local_90.p.x;
          goto LAB_001848b2;
        }
      }
    }
  }
  uVar7 = (ulong)CVar6 >> 0x20;
LAB_001848b2:
  return (CodeWord)((ulong)CVar6 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

CodeWord ReadCodeWord(BitMatrixCursor<POINT>& cur, int expectedCluster = -1)
{
	auto readCodeWord = [expectedCluster](auto& cur) -> CodeWord {
		auto np     = NormalizedPattern<8, 17>(cur.template readPattern<Pattern417>());
		int cluster = (np[0] - np[2] + np[4] - np[6] + 9) % 9;
		int code = expectedCluster == -1 || cluster == expectedCluster ? CodewordDecoder::GetCodeword(ToInt(np)) : -1;

		return {cluster, code};
	};

	auto curBackup = cur;
	auto cw = readCodeWord(cur);
	if (!cw) {
		for (auto offset : {curBackup.left(), curBackup.right()}) {
			auto curAlt = curBackup.movedBy(offset);
			if (!curAlt.isIn()) // curBackup might be the first or last image row
				continue;
			if (auto cwAlt = readCodeWord(curAlt)) {
				cur = curAlt;
				return cwAlt;
			}
		}
	}
	return cw;
}